

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_ObjCollectTfi(Acb_Ntk_t *p,int iObj,int fTerm)

{
  int iVar1;
  int iVar2;
  
  (p->vArray0).nSize = 0;
  Acb_NtkIncTravId(p);
  if (iObj < 1) {
    for (iVar2 = 0; iVar2 < (p->vCos).nSize; iVar2 = iVar2 + 1) {
      iVar1 = Vec_IntEntry(&p->vCos,iVar2);
      Acb_ObjCollectTfi_rec(p,iVar1,fTerm);
    }
  }
  else {
    for (iVar2 = 0; iVar2 < (p->vSuppOld).nSize; iVar2 = iVar2 + 1) {
      iVar1 = Vec_IntEntry(&p->vSuppOld,iVar2);
      Acb_ObjCollectTfi_rec(p,iVar1,fTerm);
    }
    Acb_ObjCollectTfi_rec(p,iObj,fTerm);
  }
  return &p->vArray0;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfi( Acb_Ntk_t * p, int iObj, int fTerm )
{
    int i, Node;
    Vec_IntClear( &p->vArray0 );
    Acb_NtkIncTravId( p );
    if ( iObj > 0 )
    {
        Vec_IntForEachEntry( &p->vSuppOld, Node, i )
            Acb_ObjCollectTfi_rec( p, Node, fTerm );
        Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    }
    else
        Acb_NtkForEachCo( p, iObj, i )
            Acb_ObjCollectTfi_rec( p, iObj, fTerm );
    return &p->vArray0;
}